

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O0

void __thiscall
presolve::HPresolve::substitute(HPresolve *this,HighsInt row,HighsInt col,double rhs)

{
  bool bVar1;
  reference pvVar2;
  uint *puVar3;
  reference pvVar4;
  reference piVar5;
  int in_EDX;
  int in_ESI;
  HPresolve *in_RDI;
  vector<double,_std::allocator<double>_> *this_00;
  double in_XMM0_Qa;
  double dVar6;
  double extraout_XMM0_Qa;
  HighsCDouble HVar7;
  HighsInt rowiter_2;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  HighsInt rowiter_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<int,_std::allocator<int>_> *__range2_1;
  HighsCDouble objscale;
  HighsInt rowiter;
  iterator __end2;
  iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  double scale;
  HighsInt colpos;
  double colval;
  HighsInt colrow;
  HighsInt coliter;
  double substrowscale;
  HighsInt pos;
  HighsCDouble *in_stack_fffffffffffffe98;
  HPresolve *in_stack_fffffffffffffea0;
  HighsCDouble *in_stack_fffffffffffffea8;
  value_type v;
  HighsCDouble *in_stack_fffffffffffffeb0;
  undefined8 in_stack_fffffffffffffec0;
  HPresolve *in_stack_fffffffffffffec8;
  HighsInt in_stack_fffffffffffffedc;
  HPresolve *in_stack_fffffffffffffee0;
  double dVar8;
  double in_stack_fffffffffffffef8;
  double in_stack_ffffffffffffff10;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffff18;
  HPresolve *in_stack_ffffffffffffff20;
  HighsCDouble local_c8;
  int local_b4;
  int *local_b0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_a8;
  vector<int,_std::allocator<int>_> *local_a0;
  double local_98;
  double local_90;
  HighsCDouble local_88;
  HighsCDouble local_78;
  int local_64;
  int *local_60;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_58;
  vector<int,_std::allocator<int>_> *local_50;
  double local_48;
  uint local_3c;
  value_type local_38;
  value_type local_30;
  uint local_2c;
  double local_28;
  HighsInt local_1c;
  double local_18;
  int local_10;
  int local_c;
  
  local_18 = in_XMM0_Qa;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_1c = findNonzero(in_stack_fffffffffffffec8,
                         (HighsInt)((ulong)in_stack_fffffffffffffec0 >> 0x20),
                         (HighsInt)in_stack_fffffffffffffec0);
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&in_RDI->Avalue,(long)local_1c);
  local_28 = -1.0 / *pvVar2;
  markRowDeleted(in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
  markColDeleted(in_stack_fffffffffffffea0,(HighsInt)((ulong)in_stack_fffffffffffffe98 >> 0x20));
  puVar3 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                             (&in_RDI->colhead,(long)local_10);
  local_2c = *puVar3;
  while (local_2c != 0xffffffff) {
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->Arow,(long)(int)local_2c);
    local_30 = *pvVar4;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&in_RDI->Avalue,(long)(int)local_2c);
    local_38 = *pvVar2;
    local_3c = local_2c;
    puVar3 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                               (&in_RDI->Anext,(long)(int)local_2c);
    local_2c = *puVar3;
    if (local_c != local_30) {
      unlink(in_RDI,(char *)(ulong)local_3c);
      local_48 = local_38 * local_28;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDI->model->row_lower_,(long)local_30);
      dVar6 = local_48;
      if ((*pvVar2 != -INFINITY) || (NAN(*pvVar2))) {
        in_stack_fffffffffffffef8 = local_18;
        pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->model->row_lower_,(long)local_30);
        *pvVar2 = dVar6 * in_stack_fffffffffffffef8 + *pvVar2;
      }
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDI->model->row_upper_,(long)local_30);
      dVar6 = local_18;
      if ((*pvVar2 != INFINITY) || (NAN(*pvVar2))) {
        dVar8 = local_48;
        pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->model->row_upper_,(long)local_30);
        *pvVar2 = dVar8 * dVar6 + *pvVar2;
      }
      local_50 = &in_RDI->rowpositions;
      local_58._M_current =
           (int *)std::vector<int,_std::allocator<int>_>::begin
                            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe98);
      local_60 = (int *)std::vector<int,_std::allocator<int>_>::end
                                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe98);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *
                                )in_stack_fffffffffffffea0,
                                (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *
                                )in_stack_fffffffffffffe98), bVar1) {
        piVar5 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*(&local_58);
        local_64 = *piVar5;
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->Acol,(long)local_64);
        if (*pvVar4 != local_10) {
          std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->Acol,(long)local_64);
          std::vector<double,_std::allocator<double>_>::operator[](&in_RDI->Avalue,(long)local_64);
          addToMatrix(in_stack_ffffffffffffff20,
                      (HighsInt)((ulong)in_stack_ffffffffffffff18._M_current >> 0x20),
                      (HighsInt)in_stack_ffffffffffffff18._M_current,in_stack_ffffffffffffff10);
        }
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (&local_58);
      }
      reinsertEquation(in_RDI,(HighsInt)((ulong)in_stack_fffffffffffffef8 >> 0x20));
    }
  }
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                     (&in_RDI->model->col_cost_,(long)local_10);
  if ((*pvVar2 != 0.0) || (NAN(*pvVar2))) {
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&in_RDI->model->col_cost_,(long)local_10);
    HighsCDouble::HighsCDouble(&local_78,*pvVar2 * local_28);
    HVar7 = HighsCDouble::operator*(in_stack_fffffffffffffeb0,(double)in_stack_fffffffffffffea8);
    local_90 = HVar7.lo;
    local_98 = HVar7.hi;
    local_88 = ::operator-((double)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    dVar6 = HighsCDouble::operator_cast_to_double(&local_88);
    in_RDI->model->offset_ = dVar6;
    local_a0 = &in_RDI->rowpositions;
    local_a8._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin
                          ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe98);
    local_b0 = (int *)std::vector<int,_std::allocator<int>_>::end
                                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe98);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                              in_stack_fffffffffffffea0,
                              (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                              in_stack_fffffffffffffe98), bVar1) {
      piVar5 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_a8);
      local_b4 = *piVar5;
      in_stack_fffffffffffffea0 = (HPresolve *)&in_RDI->model->col_cost_;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->Acol,(long)local_b4);
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffea0,
                          (long)*pvVar4);
      v = *pvVar2;
      std::vector<double,_std::allocator<double>_>::operator[](&in_RDI->Avalue,(long)local_b4);
      HighsCDouble::operator*(in_stack_fffffffffffffeb0,v);
      local_c8 = ::operator+((double)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      dVar6 = HighsCDouble::operator_cast_to_double(&local_c8);
      in_stack_fffffffffffffeb0 = (HighsCDouble *)&in_RDI->model->col_cost_;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->Acol,(long)local_b4);
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffeb0,
                          (long)*pvVar4);
      *pvVar2 = dVar6;
      this_00 = &in_RDI->model->col_cost_;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->Acol,(long)local_b4);
      std::vector<double,_std::allocator<double>_>::operator[](this_00,(long)*pvVar4);
      std::abs((int)this_00);
      if (extraout_XMM0_Qa <= (in_RDI->options->super_HighsOptionsStruct).small_matrix_value) {
        in_stack_fffffffffffffe98 = (HighsCDouble *)&in_RDI->model->col_cost_;
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->Acol,(long)local_b4);
        pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe98,
                            (long)*pvVar4);
        *pvVar2 = 0.0;
      }
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&local_a8);
    }
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&in_RDI->model->col_cost_,(long)local_10);
    *pvVar2 = 0.0;
  }
  std::vector<int,_std::allocator<int>_>::begin
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe98);
  std::vector<int,_std::allocator<int>_>::end
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe98);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                            in_stack_fffffffffffffea0,
                            (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                            in_stack_fffffffffffffe98), bVar1) {
    puVar3 = (uint *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                     operator*((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                               &stack0xffffffffffffff18);
    unlink(in_RDI,(char *)(ulong)*puVar3);
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
               &stack0xffffffffffffff18);
  }
  return;
}

Assistant:

void HPresolve::substitute(HighsInt row, HighsInt col, double rhs) {
  assert(!rowDeleted[row]);
  assert(!colDeleted[col]);
  HighsInt pos = findNonzero(row, col);
  assert(pos != -1);

  assert(Arow[pos] == row);
  assert(Acol[pos] == col);
  double substrowscale = -1.0 / Avalue[pos];
  assert(isImpliedFree(col));

  markRowDeleted(row);
  markColDeleted(col);

  // substitute the column in each row where it occurs
  for (HighsInt coliter = colhead[col]; coliter != -1;) {
    HighsInt colrow = Arow[coliter];
    double colval = Avalue[coliter];

    // walk to the next position before doing any modifications, because
    // the current position will be deleted in the loop below
    assert(Acol[coliter] == col);
    HighsInt colpos = coliter;
    coliter = Anext[coliter];

    // skip the row that is used for substitution
    if (row == colrow) continue;

    assert(findNonzero(colrow, col) != -1);

    // cancels out and bounds of dual row for this column do not need to be
    // updated
    unlink(colpos);

    // printf("\nbefore substitution: ");
    // debugPrintRow(colrow);

    // determine the scale for the substitution row for addition to this row
    double scale = colval * substrowscale;

    // adjust the sides
    if (model->row_lower_[colrow] != -kHighsInf)
      model->row_lower_[colrow] += scale * rhs;

    if (model->row_upper_[colrow] != kHighsInf)
      model->row_upper_[colrow] += scale * rhs;

    for (HighsInt rowiter : rowpositions) {
      assert(Arow[rowiter] == row);

      if (Acol[rowiter] != col)
        addToMatrix(colrow, Acol[rowiter], scale * Avalue[rowiter]);
    }

    // check if this is an equation row and it now has a different size
    reinsertEquation(colrow);
    // printf("after substitution: ");
    // debugPrintRow(colrow);
  }

  assert(colsize[col] == 1);

  // substitute column in the objective function
  if (model->col_cost_[col] != 0.0) {
    HighsCDouble objscale = model->col_cost_[col] * substrowscale;
    model->offset_ = static_cast<double>(model->offset_ - objscale * rhs);
    assert(std::isfinite(model->offset_));
    for (HighsInt rowiter : rowpositions) {
      // printf("changing col cost to %g = %g + %g * %g\n",
      // double(model->col_cost_[Acol[rowiter]] + objscale * Avalue[rowiter]),
      // model->col_cost_[Acol[rowiter]], double(objscale), Avalue[rowiter]);
      model->col_cost_[Acol[rowiter]] = static_cast<double>(
          model->col_cost_[Acol[rowiter]] + objscale * Avalue[rowiter]);
      if (std::abs(model->col_cost_[Acol[rowiter]]) <=
          options->small_matrix_value)
        model->col_cost_[Acol[rowiter]] = 0.0;
    }
    assert(std::abs(model->col_cost_[col]) <=
           std::max(options->dual_feasibility_tolerance,
                    kHighsTiny * std::abs(static_cast<double>(objscale))));
    model->col_cost_[col] = 0.0;
  }

  // finally remove the entries of the row that was used for substitution
  for (HighsInt rowiter : rowpositions) unlink(rowiter);
}